

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-readdir.c
# Opt level: O2

int run_test_fs_readdir_file(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  undefined8 uVar3;
  char *pcVar4;
  
  memset(&opendir_req,0xdb,0x1b8);
  puVar2 = uv_default_loop();
  iVar1 = uv_fs_opendir(puVar2,&opendir_req,"test/fixtures/empty_file",(uv_fs_cb)0x0);
  if (iVar1 == -0x14) {
    if (opendir_req.fs_type == UV_FS_OPENDIR) {
      if (opendir_req.result == -0x14) {
        if (opendir_req.ptr == (void *)0x0) {
          uv_fs_req_cleanup(&opendir_req);
          memset(&opendir_req,0xdb,0x1b8);
          puVar2 = uv_default_loop();
          iVar1 = uv_fs_opendir(puVar2,&opendir_req,"test/fixtures/empty_file",file_opendir_cb);
          if (iVar1 == 0) {
            if (file_opendir_cb_count == 0) {
              puVar2 = uv_default_loop();
              iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
              if (iVar1 == 0) {
                if (file_opendir_cb_count == 1) {
                  puVar2 = uv_default_loop();
                  close_loop(puVar2);
                  puVar2 = uv_default_loop();
                  iVar1 = uv_loop_close(puVar2);
                  if (iVar1 == 0) {
                    return 0;
                  }
                  pcVar4 = "0 == uv_loop_close(uv_default_loop())";
                  uVar3 = 0x105;
                }
                else {
                  pcVar4 = "file_opendir_cb_count == 1";
                  uVar3 = 0x104;
                }
              }
              else {
                pcVar4 = "r == 0";
                uVar3 = 0x103;
              }
            }
            else {
              pcVar4 = "file_opendir_cb_count == 0";
              uVar3 = 0x101;
            }
          }
          else {
            pcVar4 = "r == 0";
            uVar3 = 0x100;
          }
        }
        else {
          pcVar4 = "opendir_req.ptr == NULL";
          uVar3 = 0xf7;
        }
      }
      else {
        pcVar4 = "opendir_req.result == UV_ENOTDIR";
        uVar3 = 0xf6;
      }
    }
    else {
      pcVar4 = "opendir_req.fs_type == UV_FS_OPENDIR";
      uVar3 = 0xf5;
    }
  }
  else {
    pcVar4 = "r == UV_ENOTDIR";
    uVar3 = 0xf4;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs-readdir.c"
          ,uVar3,pcVar4);
  abort();
}

Assistant:

TEST_IMPL(fs_readdir_file) {
  const char* path;
  int r;

  path = "test/fixtures/empty_file";

  /* Fill the req to ensure that required fields are cleaned up. */
  memset(&opendir_req, 0xdb, sizeof(opendir_req));

  /* Testing the synchronous flavor. */
  r = uv_fs_opendir(uv_default_loop(), &opendir_req, path, NULL);

  ASSERT(r == UV_ENOTDIR);
  ASSERT(opendir_req.fs_type == UV_FS_OPENDIR);
  ASSERT(opendir_req.result == UV_ENOTDIR);
  ASSERT(opendir_req.ptr == NULL);

  uv_fs_req_cleanup(&opendir_req);

  /* Fill the req to ensure that required fields are cleaned up. */
  memset(&opendir_req, 0xdb, sizeof(opendir_req));

  /* Testing the async flavor. */
  r = uv_fs_opendir(uv_default_loop(), &opendir_req, path, file_opendir_cb);
  ASSERT(r == 0);
  ASSERT(file_opendir_cb_count == 0);
  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT(r == 0);
  ASSERT(file_opendir_cb_count == 1);
  MAKE_VALGRIND_HAPPY();
  return 0;
}